

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O2

bool __thiscall xmrig::CpuBackend::isEnabled(CpuBackend *this,Algorithm *algorithm)

{
  Config *this_00;
  CpuConfig *pCVar1;
  CpuThreads *pCVar2;
  
  this_00 = Base::config(&this->d_ptr->controller->super_Base);
  pCVar1 = Config::cpu(this_00);
  pCVar2 = Threads<xmrig::CpuThreads>::get(&pCVar1->m_threads);
  return (pCVar2->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         (pCVar2->m_data).super__Vector_base<xmrig::CpuThread,_std::allocator<xmrig::CpuThread>_>.
         _M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool xmrig::CpuBackend::isEnabled(const Algorithm &algorithm) const
{
    return !d_ptr->controller->config()->cpu().threads().get().isEmpty();
}